

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool isLessInfeasibleDSECandidate(HighsLogOptions *log_options,HighsLp *lp)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  value_type_conflict2 local_3c;
  vector<int,_std::allocator<int>_> col_length_k;
  
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&col_length_k,0x19,&local_3c);
  if (lp->num_col_ < 1) {
    uVar7 = 0xffffffff;
  }
  else {
    piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0xffffffff;
    lVar5 = 0;
    do {
      uVar6 = (long)piVar2[lVar5 + 1] - (long)piVar2[lVar5];
      if ((int)uVar7 < (int)uVar6) {
        uVar7 = uVar6 & 0xffffffff;
      }
      if (0x18 < (int)uVar6) {
LAB_002489cd:
        bVar4 = false;
        goto LAB_00248a41;
      }
      col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] =
           col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6] + 1;
      iVar1 = piVar2[lVar5];
      lVar5 = lVar5 + 1;
      if (iVar1 < piVar2[lVar5]) {
        lVar8 = 0;
        do {
          dVar10 = ABS(pdVar3[iVar1 + lVar8]);
          if ((dVar10 != 1.0) || (NAN(dVar10))) goto LAB_002489cd;
          lVar8 = lVar8 + 1;
        } while (piVar2[lVar5] - iVar1 != (int)lVar8);
      }
    } while (lVar5 < lp->num_col_);
  }
  bVar4 = (double)(lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lp->num_col_] / (double)lp->num_col_ <= 6.0;
  pcVar9 = "is not";
  if (bVar4) {
    pcVar9 = "is";
  }
  highsLogDev(log_options,kInfo,
              "LP %s has all |entries|=1; max column count = %d (limit %d); average column count = %0.2g (limit %d): LP is %s a candidate for LiDSE\n"
              ,(lp->model_name_)._M_dataplus._M_p,uVar7,0x18,6,pcVar9);
LAB_00248a41:
  if (col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool isLessInfeasibleDSECandidate(const HighsLogOptions& log_options,
                                  const HighsLp& lp) {
  HighsInt max_col_num_en = -1;
  const HighsInt max_allowed_col_num_en = 24;
  const HighsInt max_assess_col_num_en =
      std::max(HighsInt{9}, max_allowed_col_num_en);
  const HighsInt max_average_col_num_en = 6;
  vector<HighsInt> col_length_k;
  col_length_k.resize(1 + max_assess_col_num_en, 0);
  bool LiDSE_candidate = true;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    // Check limit on number of entries in the column has not been breached
    HighsInt col_num_en =
        lp.a_matrix_.start_[col + 1] - lp.a_matrix_.start_[col];
    max_col_num_en = std::max(col_num_en, max_col_num_en);
    if (col_num_en > max_assess_col_num_en) return false;
    col_length_k[col_num_en]++;
    for (HighsInt en = lp.a_matrix_.start_[col];
         en < lp.a_matrix_.start_[col + 1]; en++) {
      double value = lp.a_matrix_.value_[en];
      // All nonzeros must be +1 or -1
      if (fabs(value) != 1) return false;
    }
  }
  double average_col_num_en = lp.a_matrix_.start_[lp.num_col_];
  average_col_num_en = average_col_num_en / lp.num_col_;
  LiDSE_candidate =
      LiDSE_candidate && average_col_num_en <= max_average_col_num_en;
  highsLogDev(log_options, HighsLogType::kInfo,
              "LP %s has all |entries|=1; max column count = %" HIGHSINT_FORMAT
              " (limit %" HIGHSINT_FORMAT
              "); average "
              "column count = %0.2g (limit %" HIGHSINT_FORMAT
              "): LP is %s a candidate for LiDSE\n",
              lp.model_name_.c_str(), max_col_num_en, max_allowed_col_num_en,
              average_col_num_en, max_average_col_num_en,
              LiDSE_candidate ? "is" : "is not");
  return LiDSE_candidate;
}